

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O1

void tcg_gen_gvec_3_mipsel
               (TCGContext_conflict4 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t bofs,
               uint32_t oprsz,uint32_t maxsz,GVecGen3_conflict4 *g)

{
  byte bVar1;
  _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict4 *p_Var2;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict4 *p_Var3;
  TCGType_conflict TVar4;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  TCGTemp *pTVar7;
  uint uVar8;
  uint32_t uVar9;
  uintptr_t o_3;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i32 pTVar10;
  _Bool _Var11;
  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec_conflict4 *fni;
  uint32_t local_68;
  TCGv_i64 local_60;
  
  if (g->fniv == (_func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec_conflict4 *)0x0) {
    TVar4 = TCG_TYPE_I32;
  }
  else {
    TVar4 = choose_vector_type(tcg_ctx,g->opt_opc,(uint)g->vece,oprsz,g->prefer_i64);
  }
  local_68 = oprsz;
  switch(TVar4) {
  case TCG_TYPE_I32:
    if (((oprsz - 8 < 0x20) && ((oprsz & 7) == 0)) &&
       (p_Var2 = g->fni8,
       p_Var2 != (_func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict4 *)0x0)) {
      _Var11 = g->load_dest;
      uVar8 = 0;
      pTVar5 = tcg_temp_new_internal_mipsel(tcg_ctx,TCG_TYPE_I64,false);
      local_60 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
      pTVar6 = tcg_temp_new_internal_mipsel(tcg_ctx,TCG_TYPE_I64,false);
      pTVar10 = (TCGv_i32)((long)pTVar6 - (long)tcg_ctx);
      pTVar7 = tcg_temp_new_internal_mipsel(tcg_ctx,TCG_TYPE_I64,false);
      do {
        tcg_gen_op3_mipsel(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar5,
                           (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(aofs + uVar8));
        tcg_gen_op3_mipsel(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar6,
                           (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(bofs + uVar8));
        if (_Var11 != false) {
          tcg_gen_op3_mipsel(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar7,
                             (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(dofs + uVar8));
        }
        (*p_Var2)(tcg_ctx,(TCGv_i64)((long)pTVar7 - (long)tcg_ctx),local_60,(TCGv_i64)pTVar10);
        tcg_gen_op3_mipsel(tcg_ctx,INDEX_op_st_i64,(TCGArg)pTVar7,
                           (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(dofs + uVar8));
        uVar8 = uVar8 + 8;
      } while (uVar8 < oprsz);
      tcg_temp_free_internal_mipsel
                (tcg_ctx,(TCGTemp *)((TCGv_i64)((long)pTVar7 - (long)tcg_ctx) + (long)tcg_ctx));
    }
    else {
      if (((0xf < oprsz - 4) || ((oprsz & 3) != 0)) ||
         (p_Var3 = g->fni4,
         p_Var3 == (_func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict4 *)0x0)) {
        if (g->fno == (undefined1 *)0x0) {
          __assert_fail("g->fno != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                        ,0x503,
                        "void tcg_gen_gvec_3_mipsel(TCGContext *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, const GVecGen3 *)"
                       );
        }
        tcg_gen_gvec_3_ool_mipsel(tcg_ctx,dofs,aofs,bofs,oprsz,maxsz,g->data,g->fno);
        oprsz = maxsz;
        goto LAB_00860b19;
      }
      _Var11 = g->load_dest;
      uVar8 = 0;
      pTVar5 = tcg_temp_new_internal_mipsel(tcg_ctx,TCG_TYPE_I32,false);
      local_60 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
      pTVar6 = tcg_temp_new_internal_mipsel(tcg_ctx,TCG_TYPE_I32,false);
      pTVar10 = (TCGv_i32)((long)pTVar6 - (long)tcg_ctx);
      pTVar7 = tcg_temp_new_internal_mipsel(tcg_ctx,TCG_TYPE_I32,false);
      do {
        tcg_gen_op3_mipsel(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar5,
                           (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(aofs + uVar8));
        tcg_gen_op3_mipsel(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar6,
                           (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(bofs + uVar8));
        if (_Var11 != false) {
          tcg_gen_op3_mipsel(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar7,
                             (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(dofs + uVar8));
        }
        (*p_Var3)(tcg_ctx,(TCGv_i32)((long)pTVar7 - (long)tcg_ctx),(TCGv_i32)local_60,pTVar10);
        tcg_gen_op3_mipsel(tcg_ctx,INDEX_op_st_i32,(TCGArg)pTVar7,
                           (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(dofs + uVar8));
        uVar8 = uVar8 + 4;
      } while (uVar8 < oprsz);
      tcg_temp_free_internal_mipsel
                (tcg_ctx,(TCGTemp *)((TCGv_i32)((long)pTVar7 - (long)tcg_ctx) + (long)tcg_ctx));
    }
    tcg_temp_free_internal_mipsel(tcg_ctx,(TCGTemp *)((long)&tcg_ctx->pool_cur + (long)pTVar10));
    tcg_temp_free_internal_mipsel(tcg_ctx,(TCGTemp *)((long)&tcg_ctx->pool_cur + (long)local_60));
    goto LAB_00860b19;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
               ,0x50b,(char *)0x0);
  case TCG_TYPE_V64:
    bVar1 = g->vece;
    _Var11 = g->load_dest;
    fni = g->fniv;
    TVar4 = TCG_TYPE_V64;
    uVar9 = 8;
    break;
  case TCG_TYPE_V256:
    uVar8 = oprsz & 0xffffffe0;
    expand_3_vec(tcg_ctx,(uint)g->vece,dofs,aofs,bofs,uVar8,0x20,TCG_TYPE_V256,g->load_dest,g->fniv)
    ;
    if (uVar8 == oprsz) goto LAB_00860b19;
    dofs = dofs + uVar8;
    aofs = aofs + uVar8;
    bofs = bofs + uVar8;
    local_68 = oprsz & 0x1f;
    maxsz = maxsz - uVar8;
  case TCG_TYPE_V128:
    bVar1 = g->vece;
    _Var11 = g->load_dest;
    fni = g->fniv;
    TVar4 = TCG_TYPE_V128;
    uVar9 = 0x10;
    oprsz = local_68;
  }
  expand_3_vec(tcg_ctx,(uint)bVar1,dofs,aofs,bofs,oprsz,uVar9,TVar4,_Var11,fni);
LAB_00860b19:
  uVar9 = maxsz - oprsz;
  if (oprsz <= maxsz && uVar9 != 0) {
    do_dup(tcg_ctx,0,dofs + oprsz,uVar9,uVar9,(TCGv_i32)0x0,(TCGv_i64)0x0,0);
  }
  return;
}

Assistant:

void tcg_gen_gvec_3(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t bofs,
                    uint32_t oprsz, uint32_t maxsz, const GVecGen3 *g)
{
    const TCGOpcode *this_list = g->opt_opc ? g->opt_opc : vecop_list_empty;
    const TCGOpcode *hold_list = tcg_swap_vecop_list(this_list);
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs | bofs);
    check_overlap_3(dofs, aofs, bofs, maxsz);

    type = 0;
    if (g->fniv) {
        type = choose_vector_type(tcg_ctx, g->opt_opc, g->vece, oprsz, g->prefer_i64);
    }
    switch (type) {
    case TCG_TYPE_V256:
        /* Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         */
        some = QEMU_ALIGN_DOWN(oprsz, 32);
        expand_3_vec(tcg_ctx, g->vece, dofs, aofs, bofs, some, 32, TCG_TYPE_V256,
                     g->load_dest, g->fniv);
        if (some == oprsz) {
            break;
        }
        dofs += some;
        aofs += some;
        bofs += some;
        oprsz -= some;
        maxsz -= some;
        /* fallthru */
    case TCG_TYPE_V128:
        expand_3_vec(tcg_ctx, g->vece, dofs, aofs, bofs, oprsz, 16, TCG_TYPE_V128,
                     g->load_dest, g->fniv);
        break;
    case TCG_TYPE_V64:
        expand_3_vec(tcg_ctx, g->vece, dofs, aofs, bofs, oprsz, 8, TCG_TYPE_V64,
                     g->load_dest, g->fniv);
        break;

    case 0:
        if (g->fni8 && check_size_impl(oprsz, 8)) {
            expand_3_i64(tcg_ctx, dofs, aofs, bofs, oprsz, g->load_dest, g->fni8);
        } else if (g->fni4 && check_size_impl(oprsz, 4)) {
            expand_3_i32(tcg_ctx, dofs, aofs, bofs, oprsz, g->load_dest, g->fni4);
        } else {
            assert(g->fno != NULL);
            tcg_gen_gvec_3_ool(tcg_ctx, dofs, aofs, bofs, oprsz,
                               maxsz, g->data, g->fno);
            oprsz = maxsz;
        }
        break;

    default:
        g_assert_not_reached();
    }
    tcg_swap_vecop_list(hold_list);

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}